

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O2

Vta_Obj_t * Vga_ManFind(Vta_Man_t *p,int iObj,int iFrame)

{
  int *piVar1;
  Vta_Obj_t *pVVar2;
  
  piVar1 = Vga_ManLookup(p,iObj,iFrame);
  pVVar2 = Vta_ManObj(p,*piVar1);
  return pVVar2;
}

Assistant:

static inline Vta_Obj_t * Vga_ManFind( Vta_Man_t * p, int iObj, int iFrame )
{
    int * pPlace = Vga_ManLookup( p, iObj, iFrame );
    return Vta_ManObj(p, *pPlace);
}